

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
QUtil::read_lines_from_file_abi_cxx11_
          (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,QUtil *this,istream *in,bool preserve_eol)

{
  function<bool_(char_&)> local_48;
  anon_class_8_1_3fcf65e3 local_28;
  anon_class_8_1_3fcf65e3 next_char;
  bool preserve_eol_local;
  istream *in_local;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lines;
  
  next_char.in._7_1_ = (byte)in & 1;
  next_char.in._6_1_ = 0;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::list(__return_storage_ptr__);
  local_28.in = (istream *)this;
  std::function<bool(char&)>::
  function<QUtil::read_lines_from_file[abi:cxx11](std::istream&,bool)::__0&,void>
            ((function<bool(char&)> *)&local_48,&local_28);
  read_lines_from_file(&local_48,__return_storage_ptr__,(bool)(next_char.in._7_1_ & 1));
  std::function<bool_(char_&)>::~function(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::list<std::string>
QUtil::read_lines_from_file(std::istream& in, bool preserve_eol)
{
    std::list<std::string> lines;
    auto next_char = [&in](char& ch) { return (in.get(ch)) ? true : false; };
    read_lines_from_file(next_char, lines, preserve_eol);
    return lines;
}